

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::ProcessValidTx
          (PeerManagerImpl *this,NodeId nodeid,CTransactionRef *tx,
          list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *replaced_transactions)

{
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  CTxMemPool *this_00;
  char *flag;
  ConstevalFormatString<5U> in_RCX;
  TxOrphanage *in_RDX;
  char *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000050;
  long *in_stack_00000060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000070;
  unsigned_long *in_stack_00000078;
  unsigned_long *in_stack_00000080;
  CTransactionRef *removedTx;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  PeerManagerImpl *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffec8;
  int source_line;
  uint256 *in_stack_ffffffffffffff30;
  CTransaction *in_stack_ffffffffffffff38;
  PeerManagerImpl *in_stack_ffffffffffffff40;
  char *pcVar2;
  size_t in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = in_RDI;
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
             (Mutex *)0x2c8a34);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
             (AnnotatedMixin<std::mutex> *)0x2c8a53);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
             (AnnotatedMixin<std::mutex> *)0x2c8a77);
  this_00 = (CTxMemPool *)(in_RDI + 0x150);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CTransaction::GetHash
            ((CTransaction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  TxRequestTracker::ForgetTxHash
            ((TxRequestTracker *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (uint256 *)0x2c8ab1);
  flag = in_RDI + 0x150;
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CTransaction::GetWitnessHash
            ((CTransaction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<true> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  TxRequestTracker::ForgetTxHash
            ((TxRequestTracker *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (uint256 *)0x2c8aeb);
  source_line = (int)((ulong)(in_RDI + 0x460) >> 0x20);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffeb8);
  TxOrphanage::AddChildrenToWorkSet
            ((TxOrphanage *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CTransaction::GetWitnessHash
            ((CTransaction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  TxOrphanage::EraseTx(in_RDX,(Wtxid *)in_RCX.fmt);
  bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    CTransaction::GetHash
              ((CTransaction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    transaction_identifier<false>::ToString_abi_cxx11_
              ((transaction_identifier<false> *)in_stack_fffffffffffffeb0);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    CTransaction::GetWitnessHash
              ((CTransaction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    transaction_identifier<true>::ToString_abi_cxx11_
              ((transaction_identifier<true> *)in_stack_fffffffffffffeb0);
    CTxMemPool::size((CTxMemPool *)in_stack_fffffffffffffeb8);
    CTxMemPool::DynamicMemoryUsage(this_00);
    in_stack_fffffffffffffeb8 = (PeerManagerImpl *)&stack0xffffffffffffffb0;
    in_stack_fffffffffffffeb0 =
         "AcceptToMemoryPool: peer=%d: accepted %s (wtxid=%s) (poolsz %u txn, %u kB)\n";
    in_stack_fffffffffffffea8 = 1;
    logging_function._M_str = in_stack_ffffffffffffff78;
    logging_function._M_len = in_stack_ffffffffffffff70;
    source_file._M_str = pcVar2;
    source_file._M_len = (size_t)in_RDX;
    LogPrintFormatInternal<long,std::__cxx11::string,std::__cxx11::string,unsigned_long,unsigned_long>
              (logging_function,source_file,source_line,(LogFlags)flag,in_stack_00000050,in_RCX,
               in_stack_00000060,in_stack_00000068,in_stack_00000070,in_stack_00000078,
               in_stack_00000080);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CTransaction::GetHash
            ((CTransaction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CTransaction::GetWitnessHash
            ((CTransaction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<true> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  RelayTransaction(in_stack_ffffffffffffff40,(uint256 *)in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30);
  std::__cxx11::
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>::
  begin((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)in_stack_fffffffffffffeb0);
  std::__cxx11::
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>::
  end((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       *)in_stack_fffffffffffffeb0);
  while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffeb8,
                                 (_Self *)in_stack_fffffffffffffeb0), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::_List_const_iterator<std::shared_ptr<const_CTransaction>_>::operator*
              ((_List_const_iterator<std::shared_ptr<const_CTransaction>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    AddToCompactExtraTransactions
              (in_stack_fffffffffffffeb8,(CTransactionRef *)in_stack_fffffffffffffeb0);
    std::_List_const_iterator<std::shared_ptr<const_CTransaction>_>::operator++
              ((_List_const_iterator<std::shared_ptr<const_CTransaction>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessValidTx(NodeId nodeid, const CTransactionRef& tx, const std::list<CTransactionRef>& replaced_transactions)
{
    AssertLockNotHeld(m_peer_mutex);
    AssertLockHeld(g_msgproc_mutex);
    AssertLockHeld(m_tx_download_mutex);

    // As this version of the transaction was acceptable, we can forget about any requests for it.
    // No-op if the tx is not in txrequest.
    m_txrequest.ForgetTxHash(tx->GetHash());
    m_txrequest.ForgetTxHash(tx->GetWitnessHash());

    m_orphanage.AddChildrenToWorkSet(*tx);
    // If it came from the orphanage, remove it. No-op if the tx is not in txorphanage.
    m_orphanage.EraseTx(tx->GetWitnessHash());

    LogDebug(BCLog::MEMPOOL, "AcceptToMemoryPool: peer=%d: accepted %s (wtxid=%s) (poolsz %u txn, %u kB)\n",
             nodeid,
             tx->GetHash().ToString(),
             tx->GetWitnessHash().ToString(),
             m_mempool.size(), m_mempool.DynamicMemoryUsage() / 1000);

    RelayTransaction(tx->GetHash(), tx->GetWitnessHash());

    for (const CTransactionRef& removedTx : replaced_transactions) {
        AddToCompactExtraTransactions(removedTx);
    }
}